

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

float deqp::gles3::Functional::convertFloatFlushToZeroRtn
                (float value,int minExponent,int numAccurateBits)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  deUint32 u32;
  float fVar8;
  
  fVar8 = 0.0;
  if ((value != 0.0) || (NAN(value))) {
    bVar2 = 0x17 - (char)numAccurateBits;
    uVar1 = -1 << (bVar2 & 0x1f);
    if (value <= 0.0) {
      bVar7 = ((uint)value & 0x7f800000) != 0;
      uVar3 = (uint)value & 0x7fffff;
      uVar5 = uVar3 + 0x800000;
      if (uVar3 != 0 && !bVar7) {
        uVar5 = uVar3;
      }
      fVar8 = value;
      if ((uVar5 & ~uVar1) != 0) {
        iVar4 = -0x7e;
        if (uVar3 == 0 || bVar7) {
          iVar4 = ((uint)value >> 0x17 & 0xff) - 0x7f;
        }
        uVar6 = 0;
        if (((uVar5 & uVar1) != 0 || iVar4 != 0) &&
           (uVar6 = 0, iVar4 != -0x7e || 0x7fffff < (uVar5 & uVar1))) {
          uVar6 = iVar4 * 0x800000 + 0x3f800000;
        }
        if (numAccurateBits < 1) {
          fVar8 = (float)(iVar4 * 0x800000 + 0x3f800000);
        }
        else {
          fVar8 = (float)((1 << (bVar2 & 0x1f) & 0x7fffffU) + iVar4 * 0x800000 + 0x3f800000) -
                  (float)(iVar4 * 0x800000 + 0x3f800000);
        }
        return (float)(uVar1 & uVar3 | uVar6 | 0x80000000) - fVar8;
      }
    }
    else {
      uVar5 = (uint)value & 0x7fffff;
      iVar4 = -0x7e;
      if (uVar5 == 0 || 0x7fffff < (uint)value) {
        iVar4 = ((uint)value >> 0x17) - 0x7f;
      }
      if (minExponent <= iVar4) {
        uVar3 = uVar5 + 0x800000;
        if (uVar5 != 0 && 0x7fffff >= (uint)value) {
          uVar3 = uVar5;
        }
        if (value == 0.0) {
          uVar3 = 0;
        }
        uVar3 = uVar3 & uVar1;
        uVar1 = 0;
        if ((uVar3 != 0 || iVar4 != 0) && (iVar4 != -0x7e || 0x7fffff < uVar3)) {
          uVar1 = iVar4 * 0x800000 + 0x3f800000;
        }
        return (float)(uVar3 & 0x7fffff | uVar1);
      }
    }
  }
  return fVar8;
}

Assistant:

static float convertFloatFlushToZeroRtn (float value, int minExponent, int numAccurateBits)
{
	if (value == 0.0f)
	{
		return 0.0f;
	}
	else
	{
		const tcu::Float32	inputFloat			= tcu::Float32(value);
		const int			numTruncatedBits	= 23-numAccurateBits;
		const deUint32		truncMask			= (1u<<numTruncatedBits)-1u;

		if (value > 0.0f)
		{
			if (value > 0.0f && tcu::Float32(value).exponent() < minExponent)
			{
				// flush to zero if possible
				return 0.0f;
			}
			else
			{
				// just mask away non-representable bits
				return tcu::Float32::construct(+1, inputFloat.exponent(), inputFloat.mantissa() & ~truncMask).asFloat();
			}
		}
		else
		{
			if (inputFloat.mantissa() & truncMask)
			{
				// decrement one ulp if truncated bits are non-zero (i.e. if value is not representable)
				return tcu::Float32::construct(-1, inputFloat.exponent(), inputFloat.mantissa() & ~truncMask).asFloat() - getSingleULPForExponent(inputFloat.exponent(), numAccurateBits);
			}
			else
			{
				// value is representable, no need to do anything
				return value;
			}
		}
	}
}